

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int __thiscall ncnn::Reduction::load_param(Reduction *this,ParamDict *pd)

{
  int *piVar1;
  int iVar2;
  Mat *pMVar3;
  ParamDict *in_RSI;
  long in_RDI;
  bool bVar4;
  float fVar5;
  int fixbug0;
  Mat local_178;
  Mat local_130;
  ParamDict *local_e8;
  Mat *local_d0;
  int local_c8;
  undefined4 local_c4;
  Mat *local_c0;
  Mat *local_b8;
  Mat *local_b0;
  Mat *local_a8;
  Mat *local_98;
  long *local_88;
  int local_70;
  undefined4 local_6c;
  Mat *local_68;
  int local_50;
  undefined4 local_4c;
  Mat *local_48;
  int local_40;
  undefined4 local_3c;
  Mat *local_38;
  void *local_30;
  void *local_18;
  long *local_8;
  
  local_e8 = in_RSI;
  iVar2 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar2;
  iVar2 = ParamDict::get(local_e8,1,1);
  *(int *)(in_RDI + 0xd4) = iVar2;
  fVar5 = ParamDict::get(local_e8,2,1.0);
  *(float *)(in_RDI + 0xd8) = fVar5;
  local_d0 = &local_178;
  local_178.data = (void *)0x0;
  local_178.refcount = (int *)0x0;
  local_178.elemsize = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  local_178.cstep = 0;
  ParamDict::get(&local_130,local_e8,3,local_d0);
  pMVar3 = (Mat *)(in_RDI + 0xe0);
  local_c0 = &local_130;
  local_b8 = pMVar3;
  if (pMVar3 != local_c0) {
    if (local_130.refcount != (int *)0x0) {
      local_c4 = 1;
      LOCK();
      local_c8 = *local_130.refcount;
      *local_130.refcount = *local_130.refcount + 1;
      UNLOCK();
    }
    local_38 = pMVar3;
    if (*(long *)(in_RDI + 0xe8) != 0) {
      piVar1 = *(int **)(in_RDI + 0xe8);
      local_3c = 0xffffffff;
      LOCK();
      local_40 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_40 == 1) {
        if (*(long *)(in_RDI + 0x100) == 0) {
          local_30 = pMVar3->data;
          if (local_30 != (void *)0x0) {
            free(local_30);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x100) + 0x18))(*(long **)(in_RDI + 0x100),pMVar3->data)
          ;
        }
      }
    }
    pMVar3->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0xf0) = 0;
    *(undefined4 *)(in_RDI + 0xf8) = 0;
    *(undefined4 *)(in_RDI + 0x108) = 0;
    *(undefined4 *)(in_RDI + 0x10c) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x114) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined8 *)(in_RDI + 0x120) = 0;
    *(undefined8 *)(in_RDI + 0xe8) = 0;
    pMVar3->data = local_c0->data;
    *(int **)(in_RDI + 0xe8) = local_c0->refcount;
    *(size_t *)(in_RDI + 0xf0) = local_c0->elemsize;
    *(int *)(in_RDI + 0xf8) = local_c0->elempack;
    *(Allocator **)(in_RDI + 0x100) = local_c0->allocator;
    *(int *)(in_RDI + 0x108) = local_c0->dims;
    *(int *)(in_RDI + 0x10c) = local_c0->w;
    *(int *)(in_RDI + 0x110) = local_c0->h;
    *(int *)(in_RDI + 0x114) = local_c0->d;
    *(int *)(in_RDI + 0x118) = local_c0->c;
    *(size_t *)(in_RDI + 0x120) = local_c0->cstep;
  }
  local_a8 = &local_130;
  local_b0 = pMVar3;
  local_48 = local_a8;
  if (local_130.refcount != (int *)0x0) {
    local_4c = 0xffffffff;
    LOCK();
    local_50 = *local_130.refcount;
    *local_130.refcount = *local_130.refcount + -1;
    UNLOCK();
    if (local_50 == 1) {
      if (local_130.allocator == (Allocator *)0x0) {
        if (local_130.data != (void *)0x0) {
          free(local_130.data);
        }
      }
      else {
        (*(local_130.allocator)->_vptr_Allocator[3])(local_130.allocator,local_130.data);
      }
    }
  }
  local_130.data = (void *)0x0;
  local_130.elemsize = 0;
  local_130.elempack = 0;
  local_130.dims = 0;
  local_130.w = 0;
  local_130.h = 0;
  local_130.d = 0;
  local_130.c = 0;
  local_130.cstep = 0;
  local_130.refcount = (int *)0x0;
  local_98 = &local_178;
  local_68 = local_98;
  if (local_178.refcount != (int *)0x0) {
    local_6c = 0xffffffff;
    LOCK();
    local_70 = *local_178.refcount;
    *local_178.refcount = *local_178.refcount + -1;
    UNLOCK();
    if (local_70 == 1) {
      if (local_178.allocator == (Allocator *)0x0) {
        local_18 = local_178.data;
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])(local_178.allocator,local_178.data);
      }
    }
  }
  local_178.data = (void *)0x0;
  local_178.elemsize = 0;
  local_178.elempack = 0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  local_178.cstep = 0;
  local_178.refcount = (int *)0x0;
  iVar2 = ParamDict::get(local_e8,4,0);
  *(int *)(in_RDI + 0x128) = iVar2;
  iVar2 = ParamDict::get(local_e8,5,0);
  if (iVar2 == 0) {
    local_88 = (long *)(in_RDI + 0xe0);
    bVar4 = true;
    if (*local_88 != 0) {
      bVar4 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
      local_8 = local_88;
    }
    if (!bVar4) {
      fprintf(_stderr,"param is too old, please regenerate!");
      fprintf(_stderr,"\n");
      return -1;
    }
  }
  return 0;
}

Assistant:

int Reduction::load_param(const ParamDict& pd)
{
    operation = pd.get(0, 0);
    reduce_all = pd.get(1, 1);
    coeff = pd.get(2, 1.f);
    axes = pd.get(3, Mat());
    keepdims = pd.get(4, 0);

    // the original reduction handle axes as blob with batch dimension
    // ask user to regenerate param instead of producing wrong result
    int fixbug0 = pd.get(5, 0);
    if (fixbug0 == 0 && !axes.empty())
    {
        NCNN_LOGE("param is too old, please regenerate!");
        return -1;
    }

    return 0;
}